

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::ImmediatePromiseNode<kj::OwnFd>,_kj::_::PromiseDisposer>::dispose
          (Own<kj::_::ImmediatePromiseNode<kj::OwnFd>,_kj::_::PromiseDisposer> *this)

{
  ImmediatePromiseNode<kj::OwnFd> *node;
  ImmediatePromiseNode<kj::OwnFd> *ptrCopy;
  Own<kj::_::ImmediatePromiseNode<kj::OwnFd>,_kj::_::PromiseDisposer> *this_local;
  
  node = this->ptr;
  if (node != (ImmediatePromiseNode<kj::OwnFd> *)0x0) {
    this->ptr = (ImmediatePromiseNode<kj::OwnFd> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }